

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O3

void __thiscall NFALUT::NFALUT(NFALUT *this,int size,double _prob,double _logNT)

{
  int *piVar1;
  int k;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  
  uVar5 = (ulong)(uint)size;
  this->LUTSize = size;
  uVar2 = 0xffffffffffffffff;
  if (-1 < size) {
    uVar2 = (ulong)(uint)size << 2;
  }
  piVar1 = (int *)operator_new__(uVar2);
  this->LUT = piVar1;
  this->prob = _prob;
  this->logNT = _logNT;
  *piVar1 = 1;
  if (1 < size) {
    k = 1;
    lVar3 = 1;
    do {
      this->LUT[lVar3] = (int)uVar5 + 1;
      dVar6 = nfa(this,(int)lVar3,k);
      if (0.0 <= dVar6) {
LAB_0011a28f:
        this->LUT[lVar3] = k;
      }
      else {
        lVar4 = (long)k;
        if (lVar4 < lVar3) {
          do {
            lVar4 = lVar4 + 1;
            k = k + 1;
            dVar6 = nfa(this,(int)lVar3,(int)lVar4);
            if (0.0 <= dVar6) break;
          } while (lVar4 < lVar3);
          if (0.0 <= dVar6) goto LAB_0011a28f;
        }
      }
      lVar3 = lVar3 + 1;
      uVar5 = (ulong)this->LUTSize;
    } while (lVar3 < (long)uVar5);
  }
  return;
}

Assistant:

NFALUT::NFALUT(int size, double _prob, double _logNT)
{
	LUTSize = size;
	LUT = new int[LUTSize];

	prob = _prob;
	logNT = _logNT;

	LUT[0] = 1;
	int j = 1;
	for (int i = 1; i<LUTSize; i++) {
		LUT[i] = LUTSize + 1;
		double ret = nfa(i, j);
		if (ret < 0) {
			while (j < i) {
				j++;
				ret = nfa(i, j);
				if (ret >= 0) break;
			} //end-while

			if (ret < 0) continue;
		} //end-if

		LUT[i] = j;
	} //end-for
}